

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkMiterForCofactors(Abc_Ntk_t *pNtk,int Out,int In1,int In2)

{
  int iVar1;
  Abc_Ntk_t *pNtkMiter;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  char Buffer [1000];
  char local_418 [1000];
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x20b,"Abc_Ntk_t *Abc_NtkMiterForCofactors(Abc_Ntk_t *, int, int, int)");
  }
  if (pNtk->vCos->nSize <= Out) {
    __assert_fail("Out < Abc_NtkCoNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x20c,"Abc_Ntk_t *Abc_NtkMiterForCofactors(Abc_Ntk_t *, int, int, int)");
  }
  iVar1 = pNtk->vCis->nSize;
  if (iVar1 <= In1) {
    __assert_fail("In1 < Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x20d,"Abc_Ntk_t *Abc_NtkMiterForCofactors(Abc_Ntk_t *, int, int, int)");
  }
  if (iVar1 <= In2) {
    __assert_fail("In2 < Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x20e,"Abc_Ntk_t *Abc_NtkMiterForCofactors(Abc_Ntk_t *, int, int, int)");
  }
  if (pNtk->nObjCounts[8] != pNtk->vBoxes->nSize) {
    __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x20f,"Abc_Ntk_t *Abc_NtkMiterForCofactors(Abc_Ntk_t *, int, int, int)");
  }
  pNtkMiter = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  if ((-1 < Out) && (Out < pNtk->vCos->nSize)) {
    pcVar2 = Abc_ObjName((Abc_Obj_t *)pNtk->vCos->pArray[(uint)Out]);
    sprintf(local_418,"%s_miter",pcVar2);
    pcVar2 = Extra_UtilStrsav(local_418);
    pNtkMiter->pName = pcVar2;
    if (Out < pNtk->vCos->nSize) {
      pAVar5 = (Abc_Obj_t *)pNtk->vCos->pArray[(uint)Out];
      Abc_NtkMiterPrepare(pNtk,pNtk,pNtkMiter,1,-1,0);
      pAVar3 = Abc_AigConst1(pNtkMiter);
      if ((-1 < In1) && (In1 < pNtk->vCis->nSize)) {
        *(ulong *)((long)pNtk->vCis->pArray[(uint)In1] + 0x40) = (ulong)pAVar3 ^ 1;
        if (-1 < In2) {
          pAVar3 = Abc_AigConst1(pNtkMiter);
          if (pNtk->vCis->nSize <= In2) goto LAB_002d6005;
          *(Abc_Obj_t **)((long)pNtk->vCis->pArray[(uint)In2] + 0x40) = pAVar3;
        }
        Abc_NtkMiterAddCone(pNtk,pNtkMiter,pAVar5);
        pAVar3 = *(Abc_Obj_t **)
                  ((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray] + 0x40);
        pAVar4 = Abc_AigConst1(pNtkMiter);
        if (In1 < pNtk->vCis->nSize) {
          *(Abc_Obj_t **)((long)pNtk->vCis->pArray[(uint)In1] + 0x40) = pAVar4;
          if (-1 < In2) {
            pAVar4 = Abc_AigConst1(pNtkMiter);
            if (pNtk->vCis->nSize <= In2) goto LAB_002d6005;
            *(ulong *)((long)pNtk->vCis->pArray[(uint)In2] + 0x40) = (ulong)pAVar4 ^ 1;
          }
          Abc_NtkMiterAddCone(pNtk,pNtkMiter,pAVar5);
          pAVar5 = Abc_AigXor((Abc_Aig_t *)pNtkMiter->pManFunc,pAVar3,
                              *(Abc_Obj_t **)
                               ((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray] + 0x40)
                             );
          if (0 < pNtkMiter->vPos->nSize) {
            Abc_ObjAddFanin((Abc_Obj_t *)*pNtkMiter->vPos->pArray,pAVar5);
            iVar1 = Abc_NtkCheck(pNtkMiter);
            if (iVar1 == 0) {
              puts("Abc_NtkMiter: The network check has failed.");
              Abc_NtkDelete(pNtkMiter);
              pNtkMiter = (Abc_Ntk_t *)0x0;
            }
            return pNtkMiter;
          }
        }
      }
    }
  }
LAB_002d6005:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkMiterForCofactors( Abc_Ntk_t * pNtk, int Out, int In1, int In2 )
{
    char Buffer[1000];
    Abc_Ntk_t * pNtkMiter;
    Abc_Obj_t * pRoot, * pOutput1, * pOutput2, * pMiter;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( Out < Abc_NtkCoNum(pNtk) );
    assert( In1 < Abc_NtkCiNum(pNtk) );
    assert( In2 < Abc_NtkCiNum(pNtk) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk) );

    // start the new network
    pNtkMiter = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    sprintf( Buffer, "%s_miter", Abc_ObjName(Abc_NtkCo(pNtk, Out)) );
    pNtkMiter->pName = Extra_UtilStrsav(Buffer);

    // get the root output
    pRoot = Abc_NtkCo( pNtk, Out );

    // perform strashing
    Abc_NtkMiterPrepare( pNtk, pNtk, pNtkMiter, 1, -1, 0 );
    // set the first cofactor
    Abc_NtkCi(pNtk, In1)->pCopy = Abc_ObjNot( Abc_AigConst1(pNtkMiter) );
    if ( In2 >= 0 )
    Abc_NtkCi(pNtk, In2)->pCopy = Abc_AigConst1(pNtkMiter);
    // add the first cofactor
    Abc_NtkMiterAddCone( pNtk, pNtkMiter, pRoot );

    // save the output
    pOutput1 = Abc_ObjFanin0(pRoot)->pCopy;

    // set the second cofactor
    Abc_NtkCi(pNtk, In1)->pCopy = Abc_AigConst1(pNtkMiter);
    if ( In2 >= 0 )
    Abc_NtkCi(pNtk, In2)->pCopy = Abc_ObjNot( Abc_AigConst1(pNtkMiter) );
    // add the second cofactor
    Abc_NtkMiterAddCone( pNtk, pNtkMiter, pRoot );

    // save the output
    pOutput2 = Abc_ObjFanin0(pRoot)->pCopy;

    // create the miter of the two outputs
    pMiter = Abc_AigXor( (Abc_Aig_t *)pNtkMiter->pManFunc, pOutput1, pOutput2 );
    Abc_ObjAddFanin( Abc_NtkPo(pNtkMiter,0), pMiter );

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkMiter ) )
    {
        printf( "Abc_NtkMiter: The network check has failed.\n" );
        Abc_NtkDelete( pNtkMiter );
        return NULL;
    }
    return pNtkMiter;
}